

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

void __thiscall CTcParser::build_dictionaries(CTcParser *this)

{
  CTcParser *in_RDI;
  CTcGenTarg *unaff_retaddr;
  CTcSymObj *sym;
  CTcDictEntry *dict;
  _func_void_void_ptr_CTcSymbol_ptr *in_stack_ffffffffffffffd8;
  CVmHashEntry *local_18;
  CTcDictEntry *local_10;
  CTcParser *dict_00;
  
  dict_00 = in_RDI;
  get_global_symtab(in_RDI);
  CTcPrsSymtab::enum_entries((CTcPrsSymtab *)in_RDI,in_stack_ffffffffffffffd8,(void *)0x21113c);
  for (local_18 = (CVmHashEntry *)in_RDI->anon_obj_head_; local_18 != (CVmHashEntry *)0x0;
      local_18 = local_18->nxt_) {
    (*(((CTcSymObjBase *)&local_18->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x11])();
  }
  for (local_10 = in_RDI->dict_head_; local_10 != (CTcDictEntry *)0x0;
      local_10 = CTcDictEntry::get_next(local_10)) {
    CTcGenTarg::gen_code_for_dict(unaff_retaddr,(CTcDictEntry *)dict_00);
  }
  return;
}

Assistant:

void CTcParser::build_dictionaries()
{
    CTcDictEntry *dict;
    CTcSymObj *sym;
    
    /* 
     *   enumerate our symbols to insert dictionary words - this will
     *   populate each dictionary's hash table with a complete list of the
     *   words and object associations for the dictionary 
     */
    get_global_symtab()->enum_entries(&enum_sym_dict, this);

    /* do the same for the anonymous objects */
    for (sym = anon_obj_head_ ; sym != 0 ; sym = (CTcSymObj *)sym->nxt_)
        sym->build_dictionary();

    /* generate the object stream for each dictionary */
    for (dict = dict_head_ ; dict != 0 ; dict = dict->get_next())
    {
        /* generate the code (static data, actually) for this dictionary */
        G_cg->gen_code_for_dict(dict);
    }
}